

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transitions.hpp
# Opt level: O0

transition_table_type<vending::events::end_maintenance> *
afsm::transitions::
state_transition_table<afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>,vending::vending_def,unsigned_long>
::transition_table<vending::events::end_maintenance,0ul,1ul>(indexes_tuple<0UL,_1UL> *param_1)

{
  int iVar1;
  no_transition<afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::transitions::state_transition_table<afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_vending::vending_def,_unsigned_long>_>
  local_12;
  no_transition<afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::transitions::state_transition_table<afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_vending::vending_def,_unsigned_long>_>
  local_11;
  indexes_tuple<0UL,_1UL> *local_10;
  indexes_tuple<0UL,_1UL> *param_1_local;
  
  if (transition_table<vending::events::end_maintenance,0ul,1ul>(psst::meta::indexes_tuple<0ul,1ul>const&)
      ::_table == '\0') {
    local_10 = param_1;
    iVar1 = __cxa_guard_acquire(&transition_table<vending::events::end_maintenance,0ul,1ul>(psst::meta::indexes_tuple<0ul,1ul>const&)
                                 ::_table);
    if (iVar1 != 0) {
      std::
      function<afsm::actions::event_process_result(afsm::transitions::state_transition_table<afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>,vending::vending_def,unsigned_long>&,vending::events::end_maintenance&&)>
      ::
      function<afsm::transitions::detail::no_transition<afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>,afsm::transitions::state_transition_table<afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>,vending::vending_def,unsigned_long>>,void>
                ((function<afsm::actions::event_process_result(afsm::transitions::state_transition_table<afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>,vending::vending_def,unsigned_long>&,vending::events::end_maintenance&&)>
                  *)&state_transition_table<afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_vending::vending_def,_unsigned_long>
                     ::transition_table<vending::events::end_maintenance,_0UL,_1UL>::_table,
                 &local_11);
      std::
      function<afsm::actions::event_process_result(afsm::transitions::state_transition_table<afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>,vending::vending_def,unsigned_long>&,vending::events::end_maintenance&&)>
      ::
      function<afsm::transitions::detail::no_transition<afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>,afsm::transitions::state_transition_table<afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>,vending::vending_def,unsigned_long>>,void>
                ((function<afsm::actions::event_process_result(afsm::transitions::state_transition_table<afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>,vending::vending_def,unsigned_long>&,vending::events::end_maintenance&&)>
                  *)(state_transition_table<afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_vending::vending_def,_unsigned_long>
                     ::transition_table<vending::events::end_maintenance,_0UL,_1UL>::_table._M_elems
                    + 1),&local_12);
      __cxa_atexit(std::
                   array<std::function<afsm::actions::event_process_result_(afsm::transitions::state_transition_table<afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_vending::vending_def,_unsigned_long>_&,_vending::events::end_maintenance_&&)>,_2UL>
                   ::~array,&state_transition_table<afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_vending::vending_def,_unsigned_long>
                             ::transition_table<vending::events::end_maintenance,_0UL,_1UL>::_table,
                   &__dso_handle);
      __cxa_guard_release(&transition_table<vending::events::end_maintenance,0ul,1ul>(psst::meta::indexes_tuple<0ul,1ul>const&)
                           ::_table);
    }
  }
  return &state_transition_table<afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_vending::vending_def,_unsigned_long>
          ::transition_table<vending::events::end_maintenance,_0UL,_1UL>::_table;
}

Assistant:

static transition_table_type< Event > const&
    transition_table( ::psst::meta::indexes_tuple< Indexes... > const& )
    {
        using event_type = typename ::std::decay<Event>::type;
        using event_transitions = typename ::psst::meta::find_if<
                def::handles_event< event_type >::template type, transitions_tuple >::type;
        static transition_table_type< Event > _table {{
            typename detail::transition_action_selector< fsm_type, this_type,
                typename ::psst::meta::find_if<
                    def::originates_from<
                        typename inner_states_def::template type< Indexes >
                    >::template type,
                    event_transitions
                >::type >::type{} ...
        }};
        return _table;
    }